

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall
diligent_spirv_cross::Compiler::ActiveBuiltinHandler::handle
          (ActiveBuiltinHandler *this,Op opcode,uint32_t *args,uint32_t length)

{
  ID *__k;
  uint uVar1;
  Variant *pVVar2;
  Decoration *pDVar3;
  SPIRVariable *var;
  SPIRType *pSVar4;
  SPIRConstant *pSVar5;
  mapped_type *pmVar6;
  SPIRType *type;
  TypeID *pTVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  __hashtable *__h;
  BuiltIn local_5c;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_58;
  Bitset *local_50;
  ulong local_48;
  uint32_t *local_40;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_38;
  
  bVar10 = true;
  if ((int)opcode < 0x53) {
    switch(opcode) {
    case OpFunctionCall:
      if (2 < length) {
        if (length - 3 != 0) {
          uVar9 = 0;
          do {
            add_if_builtin(this,args[uVar9 + 3],false);
            uVar9 = uVar9 + 1;
          } while (length - 3 != uVar9);
          return true;
        }
        return true;
      }
      break;
    default:
      goto switchD_007c7bc3_caseD_3a;
    case OpLoad:
switchD_007c7bc3_caseD_3d:
      if (2 < length) {
        args = args + 2;
LAB_007c7e8f:
        add_if_builtin(this,*args,false);
        return true;
      }
      break;
    case OpStore:
      if (length != 0) goto LAB_007c7e8f;
      break;
    case OpCopyMemory:
      if (1 < length) {
        add_if_builtin(this,*args,false);
        args = args + 1;
        goto LAB_007c7e8f;
      }
      break;
    case OpAccessChain:
    case OpInBoundsAccessChain:
    case OpPtrAccessChain:
      if (3 < length) {
        uVar9 = (ulong)args[2];
        if ((uVar9 < (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.
                     buffer_size) &&
           (pVVar2 = (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
           pVVar2[uVar9].type == TypeVariable)) {
          var = Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar2 + uVar9);
        }
        else {
          var = (SPIRVariable *)0x0;
        }
        if (var == (SPIRVariable *)0x0) {
          return true;
        }
        add_if_builtin(this,args[2],false);
        pSVar4 = get_variable_data_type(this->compiler,var);
        bVar10 = var->storage != Input;
        if (length - 3 == 0) {
          return true;
        }
        local_50 = &this->compiler->active_input_builtins + bVar10;
        local_58 = &(&this->compiler->active_input_builtins)[bVar10].higher;
        uVar9 = (ulong)(length - 3);
        uVar8 = 0;
        local_48 = uVar9;
        local_40 = args;
        do {
          if (opcode != OpPtrAccessChain || uVar8 != 0) {
            if ((pSVar4->array).super_VectorView<unsigned_int>.buffer_size == 0) {
              if (pSVar4->basetype != Struct) {
                return true;
              }
              pSVar5 = Variant::get<diligent_spirv_cross::SPIRConstant>
                                 ((this->compiler->ir).ids.
                                  super_VectorView<diligent_spirv_cross::Variant>.ptr +
                                  local_40[uVar8 + 3]);
              uVar1 = (pSVar5->m).c[0].r[0].u32;
              __k = &(pSVar4->super_IVariant).self;
              pmVar6 = ::std::__detail::
                       _Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&(this->compiler->ir).meta,__k);
              if (uVar1 < (uint)(pmVar6->members).
                                super_VectorView<diligent_spirv_cross::Meta::Decoration>.buffer_size
                 ) {
                pmVar6 = ::std::__detail::
                         _Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)&(this->compiler->ir).meta,__k);
                pDVar3 = (pmVar6->members).super_VectorView<diligent_spirv_cross::Meta::Decoration>.
                         ptr;
                if (pDVar3[uVar1].builtin == true) {
                  local_5c = pDVar3[uVar1].builtin_type;
                  if (local_5c < 0x40) {
                    local_50->lower = local_50->lower | 1L << ((byte)local_5c & 0x3f);
                  }
                  else {
                    local_38 = local_58;
                    ::std::
                    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    ::
                    _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                              (local_58,(_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                         *)&local_5c,&local_38);
                  }
                  type = Variant::get<diligent_spirv_cross::SPIRType>
                                   ((this->compiler->ir).ids.
                                    super_VectorView<diligent_spirv_cross::Variant>.ptr +
                                    (pSVar4->member_types).
                                    super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                                    .ptr[uVar1].id);
                  handle_builtin(this,type,pDVar3[uVar1].builtin_type,
                                 &pDVar3[uVar1].decoration_flags);
                }
              }
              pTVar7 = (pSVar4->member_types).
                       super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                       .ptr + uVar1;
              uVar9 = local_48;
            }
            else {
              pTVar7 = &pSVar4->parent_type;
            }
            pSVar4 = Variant::get<diligent_spirv_cross::SPIRType>
                               ((this->compiler->ir).ids.
                                super_VectorView<diligent_spirv_cross::Variant>.ptr + pTVar7->id);
          }
          uVar8 = uVar8 + 1;
        } while (uVar9 != uVar8);
        return true;
      }
    }
  }
  else {
    if (opcode == OpCopyObject) goto switchD_007c7bc3_caseD_3d;
    if (opcode == OpSelect) {
      if (4 < length) {
        add_if_builtin(this,args[3],false);
        args = args + 4;
        goto LAB_007c7e8f;
      }
    }
    else {
      if (opcode != OpPhi) {
        return true;
      }
      if (1 < length) {
        if (length - 2 != 0) {
          uVar9 = 0;
          do {
            add_if_builtin(this,args[uVar9 + 2],false);
            uVar9 = uVar9 + 2;
          } while (uVar9 < length - 2);
          return true;
        }
        return true;
      }
    }
  }
  bVar10 = false;
switchD_007c7bc3_caseD_3a:
  return bVar10;
}

Assistant:

bool Compiler::ActiveBuiltinHandler::handle(spv::Op opcode, const uint32_t *args, uint32_t length)
{
	switch (opcode)
	{
	case OpStore:
		if (length < 1)
			return false;

		add_if_builtin(args[0]);
		break;

	case OpCopyMemory:
		if (length < 2)
			return false;

		add_if_builtin(args[0]);
		add_if_builtin(args[1]);
		break;

	case OpCopyObject:
	case OpLoad:
		if (length < 3)
			return false;

		add_if_builtin(args[2]);
		break;

	case OpSelect:
		if (length < 5)
			return false;

		add_if_builtin(args[3]);
		add_if_builtin(args[4]);
		break;

	case OpPhi:
	{
		if (length < 2)
			return false;

		uint32_t count = length - 2;
		args += 2;
		for (uint32_t i = 0; i < count; i += 2)
			add_if_builtin(args[i]);
		break;
	}

	case OpFunctionCall:
	{
		if (length < 3)
			return false;

		uint32_t count = length - 3;
		args += 3;
		for (uint32_t i = 0; i < count; i++)
			add_if_builtin(args[i]);
		break;
	}

	case OpAccessChain:
	case OpInBoundsAccessChain:
	case OpPtrAccessChain:
	{
		if (length < 4)
			return false;

		// Only consider global variables, cannot consider variables in functions yet, or other
		// access chains as they have not been created yet.
		auto *var = compiler.maybe_get<SPIRVariable>(args[2]);
		if (!var)
			break;

		// Required if we access chain into builtins like gl_GlobalInvocationID.
		add_if_builtin(args[2]);

		// Start traversing type hierarchy at the proper non-pointer types.
		auto *type = &compiler.get_variable_data_type(*var);

		auto &flags =
		    var->storage == StorageClassInput ? compiler.active_input_builtins : compiler.active_output_builtins;

		uint32_t count = length - 3;
		args += 3;
		for (uint32_t i = 0; i < count; i++)
		{
			// Pointers
			// PtrAccessChain functions more like a pointer offset. Type remains the same.
			if (opcode == OpPtrAccessChain && i == 0)
				continue;

			// Arrays
			if (!type->array.empty())
			{
				type = &compiler.get<SPIRType>(type->parent_type);
			}
			// Structs
			else if (type->basetype == SPIRType::Struct)
			{
				uint32_t index = compiler.get<SPIRConstant>(args[i]).scalar();

				if (index < uint32_t(compiler.ir.meta[type->self].members.size()))
				{
					auto &decorations = compiler.ir.meta[type->self].members[index];
					if (decorations.builtin)
					{
						flags.set(decorations.builtin_type);
						handle_builtin(compiler.get<SPIRType>(type->member_types[index]), decorations.builtin_type,
						               decorations.decoration_flags);
					}
				}

				type = &compiler.get<SPIRType>(type->member_types[index]);
			}
			else
			{
				// No point in traversing further. We won't find any extra builtins.
				break;
			}
		}
		break;
	}

	default:
		break;
	}

	return true;
}